

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFLogger.cc
# Opt level: O2

void __thiscall
QPDFLogger::setOutputStreams(QPDFLogger *this,ostream *out_stream,ostream *err_stream)

{
  element_type *peVar1;
  __shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  ostream *poVar3;
  shared_ptr<Pipeline> new_out;
  shared_ptr<Pipeline> new_err;
  __shared_ptr<Pl_OStream,_(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2> local_38;
  __shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  poVar3 = (ostream *)0x0;
  if (err_stream != (ostream *)&std::cerr) {
    poVar3 = err_stream;
  }
  local_38._M_ptr = (element_type *)0x0;
  local_38._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_28._M_ptr = (element_type *)0x0;
  local_28._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (out_stream == (ostream *)&std::cout || out_stream == (ostream *)0x0) {
    peVar1 = (this->m).super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar1->p_save).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (peVar1->p_stdout).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
      p_Var2 = &(peVar1->p_stderr).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>;
    }
    else {
      p_Var2 = &(peVar1->p_stdout).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>;
    }
    std::__shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>::operator=(&local_38,p_Var2);
  }
  else {
    std::make_shared<Pl_OStream,char_const(&)[7],std::ostream&>
              ((char (*) [7])&local_48,(basic_ostream<char,_std::char_traits<char>_> *)0x21b444);
    std::__shared_ptr<Pipeline,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<Pipeline,(__gnu_cxx::_Lock_policy)2> *)&local_38,&local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  }
  if (poVar3 == (ostream *)0x0) {
    std::__shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_28,
               &(((this->m).super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->p_stderr).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>);
  }
  else {
    std::make_shared<Pl_OStream,char_const(&)[13],std::ostream&>
              ((char (*) [13])&local_48,
               (basic_ostream<char,_std::char_traits<char>_> *)"error output");
    std::__shared_ptr<Pipeline,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<Pipeline,(__gnu_cxx::_Lock_policy)2> *)&local_28,&local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  }
  std::__shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(((this->m).super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->p_info).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>,&local_38);
  local_48._M_ptr = (element_type *)0x0;
  local_48._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(((this->m).super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->p_warn).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2> *)&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  std::__shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(((this->m).super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->p_error).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>,&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  return;
}

Assistant:

void
QPDFLogger::setOutputStreams(std::ostream* out_stream, std::ostream* err_stream)
{
    if (out_stream == &std::cout) {
        out_stream = nullptr;
    }
    if (err_stream == &std::cerr) {
        err_stream = nullptr;
    }
    std::shared_ptr<Pipeline> new_out;
    std::shared_ptr<Pipeline> new_err;

    if (out_stream == nullptr) {
        if (m->p_save == m->p_stdout) {
            new_out = m->p_stderr;
        } else {
            new_out = m->p_stdout;
        }
    } else {
        new_out = std::make_shared<Pl_OStream>("output", *out_stream);
    }
    if (err_stream == nullptr) {
        new_err = m->p_stderr;
    } else {
        new_err = std::make_shared<Pl_OStream>("error output", *err_stream);
    }
    m->p_info = new_out;
    m->p_warn = nullptr;
    m->p_error = new_err;
}